

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[14],unsigned_int,char[11],unsigned_int,char[17],unsigned_long,char[48],unsigned_int,char[2]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [14],uint *RestArgs,char (*RestArgs_1) [11],uint *RestArgs_2,
               char (*RestArgs_3) [17],unsigned_long *RestArgs_4,char (*RestArgs_5) [48],
               uint *RestArgs_6,char (*RestArgs_7) [2])

{
  char (*RestArgs_local_3) [17];
  uint *RestArgs_local_2;
  char (*RestArgs_local_1) [11];
  uint *RestArgs_local;
  char (*FirstArg_local) [14];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[14]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_int,char[11],unsigned_int,char[17],unsigned_long,char[48],unsigned_int,char[2]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}